

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecdsa_edge_cases(void)

{
  char cVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  long lVar26;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar27;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *psVar28;
  secp256k1_context *psVar29;
  secp256k1_context *psVar30;
  secp256k1_context *psVar31;
  secp256k1_context *psVar32;
  code *pcVar33;
  secp256k1_scalar *psVar34;
  secp256k1_scalar *psVar35;
  uchar *p1;
  undefined1 *puVar36;
  char *pcVar37;
  char *pcVar38;
  long lVar39;
  code *in_R8;
  secp256k1_scalar *sigr;
  secp256k1_gej *r;
  bool bVar40;
  secp256k1_scalar sr;
  size_t siglen;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  secp256k1_scalar ss_2;
  secp256k1_ecdsa_signature sig;
  uchar msg_3 [32];
  secp256k1_gej keyj;
  undefined1 local_4178 [8];
  undefined8 uStack_4170;
  undefined1 auStack_4168 [16];
  secp256k1_context *local_4150;
  undefined1 local_4148 [4];
  undefined1 auStack_4144 [12];
  undefined1 auStack_4138 [15];
  undefined1 uStack_4129;
  undefined1 local_4128 [4];
  undefined1 auStack_4124 [12];
  uint64_t local_4118;
  uint64_t uStack_4110;
  uint64_t local_4108;
  uint64_t uStack_4100;
  uint64_t local_40f8;
  uint64_t uStack_40f0;
  undefined1 local_40e8 [48];
  undefined1 local_40b8 [96];
  uint64_t local_4058 [3];
  undefined8 uStack_4040;
  secp256k1_gej local_4038 [64];
  uint64_t auStack_2038 [1025];
  
  psVar28 = (secp256k1_context *)local_4178;
  psVar29 = (secp256k1_context *)local_4178;
  psVar30 = (secp256k1_context *)local_4178;
  psVar31 = (secp256k1_context *)local_4178;
  psVar32 = (secp256k1_context *)local_4178;
  pcVar33 = (code *)local_4178;
  sigr = (secp256k1_scalar *)local_4178;
  psVar35 = (secp256k1_scalar *)local_4178;
  psVar34 = (secp256k1_scalar *)local_4148;
  _local_4148 = ZEXT816(1);
  _auStack_4138 = ZEXT816(0);
  secp256k1_scalar_negate(psVar34,psVar34);
  secp256k1_scalar_inverse(psVar34,psVar34);
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  r = local_4038;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,r,(secp256k1_scalar *)local_4178);
  secp256k1_ge_set_gej((secp256k1_ge *)local_40b8,r);
  psVar27 = (secp256k1_context *)local_4128;
  local_4118 = auStack_4138._0_8_;
  uStack_4110 = stack0xffffffffffffbed0;
  _local_4128 = _local_4148;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,psVar34,(secp256k1_ge *)local_40b8,
                      (secp256k1_scalar *)psVar27);
  if (iVar25 != 0) goto LAB_0016e280;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  local_40b8._0_8_ = (void *)0x0;
  local_40b8._8_8_ = 0;
  local_40b8._16_8_ = 0;
  local_40b8._24_8_ = 0;
  _local_4128 = ZEXT816(0);
  local_4118 = 0;
  uStack_4110 = 0;
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00189dd0,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e285;
  psVar27 = (secp256k1_context *)local_40b8;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)psVar27);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e28a;
  local_40b8._8_8_ = 0;
  local_40b8._16_8_ = 0;
  local_40b8._24_8_ = 0;
  local_40b8._0_8_ = (void *)0x2;
  local_40b8[0x20] = '\x01';
  _auStack_4138 = ZEXT816(0);
  _local_4148 = ZEXT816(0);
  _local_4128 = ZEXT816(0);
  local_4118 = 0;
  uStack_4110 = 0;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  auStack_4168 = ZEXT816(0);
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,local_40b8,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e28f;
  psVar27 = (secp256k1_context *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)psVar27);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e294;
  local_4118 = 0;
  uStack_4110 = 0;
  stack0xffffffffffffbed9 = ZEXT715(0);
  local_4128[0] = 2;
  local_4108 = CONCAT71(local_4108._1_7_,2);
  local_40e8._0_8_ = 2;
  local_40e8._8_8_ = 0;
  local_40e8._16_8_ = 0;
  psVar27 = (secp256k1_context *)0x0;
  local_40e8._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  _local_4178 = (secp256k1_callback)ZEXT816(0);
  auStack_4168 = ZEXT816(0);
  _local_4148 = ZEXT816(2);
  _auStack_4138 = ZEXT816(0);
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,local_4128,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e299;
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_40b8,&DAT_00189e00,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e29e;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_40e8,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2a3;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_40e8,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2a8;
  psVar34 = (secp256k1_scalar *)local_40e8;
  secp256k1_scalar_negate(psVar34,psVar34);
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,psVar34,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2ad;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_40e8,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2b2;
  local_40e8._0_8_ = 1;
  local_40e8._8_8_ = 0;
  local_40e8._16_8_ = 0;
  local_40e8._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_40e8,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e2b7;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_40e8,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e2bc;
  _local_4148 = ZEXT816(1);
  pcVar33 = (code *)0x0;
  _auStack_4138 = ZEXT816(0);
  _local_4128 = ZEXT816(1);
  local_4118 = 0;
  uStack_4110 = 0;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4178,"",(int *)0x0);
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00189e30,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2c1;
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_40b8,&DAT_00189e60,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2c6;
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2cb;
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2d0;
  psVar34 = (secp256k1_scalar *)local_4148;
  secp256k1_scalar_negate(psVar34,psVar34);
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,psVar34,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2d5;
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2da;
  _local_4148 = ZEXT816(2);
  _auStack_4138 = ZEXT816(0);
  psVar34 = (secp256k1_scalar *)local_4148;
  secp256k1_scalar_inverse_var(psVar34,psVar34);
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,psVar34,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e2df;
  r = (secp256k1_gej *)local_4148;
  pcVar33 = (code *)local_4128;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)r,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e2e4;
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  pcVar33 = (code *)0x0;
  auStack_4168 = ZEXT816(0);
  local_40b8._0_8_ = (void *)0x1;
  local_40b8._8_8_ = 0;
  local_40b8._16_8_ = 0;
  local_40b8._24_8_ = 0;
  secp256k1_scalar_negate((secp256k1_scalar *)local_40b8,(secp256k1_scalar *)local_40b8);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4128,"",(int *)0x0);
  iVar25 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00189e90,0x21);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2e9;
  pcVar33 = (code *)local_40b8;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)pcVar33);
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2ee;
  secp256k1_scalar_negate((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
  pcVar33 = (code *)local_40b8;
  iVar25 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)pcVar33);
  psVar34 = (secp256k1_scalar *)local_4178;
  sigr = (secp256k1_scalar *)local_4178;
  if (iVar25 == 0) goto LAB_0016e2f3;
  _local_4178 = (secp256k1_callback)ZEXT816(3);
  auStack_4168 = ZEXT816(0);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
  sigr = (secp256k1_scalar *)local_4128;
  pcVar33 = (code *)local_40b8;
  iVar25 = secp256k1_ecdsa_sig_verify
                     (sigr,(secp256k1_scalar *)local_4178,(secp256k1_ge *)local_4038,
                      (secp256k1_scalar *)pcVar33);
  if (iVar25 != 0) goto LAB_0016e2f8;
  pcVar33 = (code *)local_40e8;
  local_40e8[0x10] = '\0';
  local_40e8[0x11] = '\0';
  local_40e8[0x12] = '\0';
  local_40e8[0x13] = '\0';
  local_40e8[0x14] = '\0';
  local_40e8[0x15] = '\0';
  local_40e8[0x16] = '\0';
  local_40e8[0x17] = '\0';
  local_40e8[0x18] = '\0';
  local_40e8[0x19] = '\0';
  local_40e8[0x1a] = '\0';
  local_40e8[0x1b] = '\0';
  local_40e8[0x1c] = '\0';
  local_40e8[0x1d] = '\0';
  local_40e8[0x1e] = '\0';
  local_40e8[0x1f] = '\x01';
  local_40e8[0] = '\0';
  local_40e8[1] = '\0';
  local_40e8[2] = '\0';
  local_40e8[3] = '\0';
  local_40e8[4] = '\0';
  local_40e8[5] = '\0';
  local_40e8[6] = '\0';
  local_40e8[7] = '\0';
  local_40e8[8] = '\0';
  local_40e8[9] = '\0';
  local_40e8[10] = '\0';
  local_40e8[0xb] = '\0';
  local_40e8[0xc] = '\0';
  local_40e8[0xd] = '\0';
  local_40e8[0xe] = '\0';
  local_40e8[0xf] = '\0';
  local_4058[2] = 0x62777a810be012b8;
  uStack_4040 = (_func_void_char_ptr_void_ptr *)0xa9293eb931dddf65;
  local_4058[0] = 0x5344230681994186;
  local_4058[1] = 0xf7f478316a9d5faa;
  in_R8 = precomputed_nonce_function;
  iVar25 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                      (uchar *)pcVar33,precomputed_nonce_function,"");
  psVar35 = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e2fd;
  in_R8 = precomputed_nonce_function;
  pcVar33 = (code *)local_40e8;
  iVar25 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                      (uchar *)pcVar33,precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar35 = (secp256k1_scalar *)local_4178;
  if (iVar25 != 0) goto LAB_0016e302;
  uStack_4040 = (_func_void_char_ptr_void_ptr *)CONCAT17(0xaa,(undefined7)uStack_4040);
  in_R8 = precomputed_nonce_function;
  pcVar33 = (code *)local_40e8;
  iVar25 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                      (uchar *)pcVar33,precomputed_nonce_function,"");
  psVar27 = CTX;
  psVar35 = (secp256k1_scalar *)local_4178;
  if (iVar25 != 1) goto LAB_0016e307;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = auStack_4124;
  _local_4128 = auVar5 << 0x20;
  local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
  local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
  psVar35 = (secp256k1_scalar *)local_4178;
  if (secp256k1_context_static == CTX) goto LAB_0016e30c;
  pcVar33 = counting_callback_fn;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = sigr;
  psVar35 = (secp256k1_scalar *)local_4178;
LAB_0016d0fe:
  pcVar37 = "signature != NULL";
  if ((psVar27->ecmult_gen_ctx).built == 0) {
    pcVar37 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(psVar27->illegal_callback).fn)(pcVar37,(psVar27->illegal_callback).data);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    pcVar33 = (code *)&psVar27->illegal_callback;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_4124;
    _local_4128 = auVar6 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)((secp256k1_callback *)pcVar33)->fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e331;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = sigr;
  }
  else {
    test_ecdsa_edge_cases_cold_12();
    psVar27 = extraout_RAX_00;
LAB_0016e331:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    psVar27 = CTX;
  }
  pcVar37 = "msghash32 != NULL";
  if ((psVar27->ecmult_gen_ctx).built == 0) {
    pcVar37 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(psVar27->illegal_callback).fn)(pcVar37,(psVar27->illegal_callback).data);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    pcVar33 = (code *)&psVar27->illegal_callback;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_4124;
    _local_4128 = auVar7 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)((secp256k1_callback *)pcVar33)->fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e356;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = sigr;
  }
  else {
    test_ecdsa_edge_cases_cold_13();
    psVar27 = extraout_RAX_01;
LAB_0016e356:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    psVar27 = CTX;
  }
  pcVar37 = "seckey != NULL";
  pcVar38 = "seckey != NULL";
  if ((psVar27->ecmult_gen_ctx).built == 0) {
    pcVar38 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(psVar27->illegal_callback).fn)(pcVar38,(psVar27->illegal_callback).data);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4128 == (undefined1  [4])0x1) {
    in_R8 = precomputed_nonce_function;
    pcVar33 = (code *)local_40e8;
    iVar25 = secp256k1_ecdsa_sign
                       (psVar27,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                        (uchar *)pcVar33,precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar25 != 1) goto LAB_0016e37b;
    iVar25 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4128,local_40e8);
    psVar27 = CTX;
    if (iVar25 == 0) goto LAB_0016e380;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar8 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    pcVar33 = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0016e385;
    pcVar33 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = psVar35;
  }
  else {
    test_ecdsa_edge_cases_cold_14();
LAB_0016e37b:
    test_ecdsa_edge_cases_cold_15();
LAB_0016e380:
    test_ecdsa_edge_cases_cold_66();
LAB_0016e385:
    (*(((secp256k1_context *)pcVar33)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)pcVar33)->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    psVar35 = (secp256k1_scalar *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sig != NULL",psVar35);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar9 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e3b8;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
    puVar36 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_16();
    psVar27 = extraout_RAX_02;
LAB_0016e3b8:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("msghash32 != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar10._12_4_ = 0;
    auVar10._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar10 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e3eb;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
    puVar36 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_17();
    psVar27 = extraout_RAX_03;
LAB_0016e3eb:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("pubkey != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    iVar25 = secp256k1_ecdsa_verify
                       (psVar27,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                        (secp256k1_pubkey *)local_4128);
    psVar27 = CTX;
    if (iVar25 == 0) goto LAB_0016e41e;
    auVar11._12_4_ = 0;
    auVar11._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar11 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (secp256k1_context_static == CTX) goto LAB_0016e423;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_18();
LAB_0016e41e:
    test_ecdsa_edge_cases_cold_65();
    psVar27 = extraout_RAX_04;
LAB_0016e423:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    psVar27 = CTX;
  }
  local_40f8 = 0;
  uStack_40f0 = 0;
  local_4108 = 0;
  uStack_4100 = 0;
  local_4118 = 0;
  uStack_4110 = 0;
  _local_4128 = ZEXT816(0);
  if ((psVar27->ecmult_gen_ctx).built == 0) {
    pcVar37 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  (*(psVar27->illegal_callback).fn)(pcVar37,(psVar27->illegal_callback).data);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar12._12_4_ = 0;
    auVar12._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar12 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e448;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_19();
    psVar27 = extraout_RAX_05;
LAB_0016e448:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    psVar27 = CTX;
  }
  iVar25 = secp256k1_ecdsa_verify
                     (psVar27,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4058,
                      (secp256k1_pubkey *)local_4128);
  psVar27 = CTX;
  if (iVar25 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0016e46d;
    local_4150 = (secp256k1_context *)0x48;
    auVar13._12_4_ = 0;
    auVar13._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar13 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e472;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
    puVar36 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_20();
LAB_0016e46d:
    test_ecdsa_edge_cases_cold_21();
    psVar27 = extraout_RAX_06;
LAB_0016e472:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("output != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar14 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e4a5;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
    puVar36 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_22();
    psVar27 = extraout_RAX_07;
LAB_0016e4a5:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("outputlen != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar15 << 0x20);
    local_4038[0].x.n[0] = (uint64_t)(psVar27->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar27->illegal_callback).data;
    if (secp256k1_context_static == psVar27) goto LAB_0016e4d8;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = local_4178;
    puVar36 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_23();
    psVar27 = extraout_RAX_08;
LAB_0016e4d8:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sig != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
  (psVar27->illegal_callback).data = (void *)local_4038[0].x.n[1];
  if (local_4178._0_4_ == 1) {
    pcVar33 = (code *)local_40b8;
    iVar25 = secp256k1_ecdsa_signature_serialize_der
                       (psVar27,(uchar *)local_4038,(size_t *)&local_4150,
                        (secp256k1_ecdsa_signature *)pcVar33);
    psVar27 = CTX;
    if (iVar25 == 0) goto LAB_0016e50b;
    auVar16._12_4_ = 0;
    auVar16._0_12_ = auStack_4144;
    _local_4148 = auVar16 << 0x20;
    _local_4178 = CTX->illegal_callback;
    pcVar33 = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0016e510;
    pcVar33 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = r;
  }
  else {
    test_ecdsa_edge_cases_cold_24();
LAB_0016e50b:
    test_ecdsa_edge_cases_cold_64();
LAB_0016e510:
    (*(((secp256k1_context *)pcVar33)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)pcVar33)->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    r = (secp256k1_gej *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sig != NULL",r);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = auStack_4144;
    _local_4148 = auVar17 << 0x20;
    _local_4178 = psVar27->illegal_callback;
    if (secp256k1_context_static == psVar27) goto LAB_0016e543;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    puVar36 = local_4148;
    (psVar27->illegal_callback).data = puVar36;
  }
  else {
    test_ecdsa_edge_cases_cold_25();
    psVar27 = extraout_RAX_09;
LAB_0016e543:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("input != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    pcVar33 = (code *)local_4150;
    iVar25 = secp256k1_ecdsa_signature_parse_der
                       (psVar27,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4038,
                        (size_t)local_4150);
    if (iVar25 == 0) goto LAB_0016e576;
    local_4150 = (secp256k1_context *)0xa;
    pcVar33 = (code *)local_40b8;
    iVar25 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,(size_t *)&local_4150,
                        (secp256k1_ecdsa_signature *)pcVar33);
    psVar27 = CTX;
    if (iVar25 != 0) goto LAB_0016e57b;
    auVar18._12_4_ = 0;
    auVar18._0_12_ = auStack_4144;
    _local_4148 = auVar18 << 0x20;
    _local_4178 = CTX->illegal_callback;
    pcVar33 = (code *)CTX;
    if (secp256k1_context_static == CTX) goto LAB_0016e580;
    pcVar33 = counting_callback_fn;
    (CTX->illegal_callback).fn = counting_callback_fn;
    puVar36 = local_4148;
    (psVar27->illegal_callback).data = puVar36;
  }
  else {
    test_ecdsa_edge_cases_cold_26();
LAB_0016e576:
    test_ecdsa_edge_cases_cold_63();
LAB_0016e57b:
    test_ecdsa_edge_cases_cold_27();
LAB_0016e580:
    (*(((secp256k1_context *)pcVar33)->illegal_callback).fn)
              ("ctx != secp256k1_context_static",
               (((secp256k1_context *)pcVar33)->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sigin != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = auStack_4144;
    _local_4148 = auVar19 << 0x20;
    _local_4178 = psVar27->illegal_callback;
    if (secp256k1_context_static == psVar27) goto LAB_0016e5b3;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    puVar36 = local_4148;
    (psVar27->illegal_callback).data = puVar36;
  }
  else {
    test_ecdsa_edge_cases_cold_28();
    psVar27 = extraout_RAX_10;
LAB_0016e5b3:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("output64 != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar20._12_4_ = 0;
    auVar20._0_12_ = auStack_4144;
    _local_4148 = auVar20 << 0x20;
    _local_4178 = psVar27->illegal_callback;
    if (secp256k1_context_static == psVar27) goto LAB_0016e5e6;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    puVar36 = local_4148;
    (psVar27->illegal_callback).data = puVar36;
  }
  else {
    test_ecdsa_edge_cases_cold_29();
    psVar27 = extraout_RAX_11;
LAB_0016e5e6:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sig != NULL",puVar36);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    stack0xffffffffffffbeb9 = local_40b8._33_7_;
    local_4148[0] = local_40b8[0x20];
    local_4178 = (undefined1  [8])local_40b8._0_8_;
    uStack_4170 = (void *)local_40b8._8_8_;
    auStack_4168._8_8_ = local_40b8._24_8_;
    auStack_4168._0_8_ = local_40b8._16_8_;
    psVar34 = (secp256k1_scalar *)local_4148;
    auStack_4144._4_8_ = local_40b8._40_8_;
    stack0xffffffffffffbed0 = local_40b8._56_8_;
    auStack_4138._0_8_ = local_40b8._48_8_;
    secp256k1_scalar_get_b32((uchar *)local_4038,(secp256k1_scalar *)local_4178);
    secp256k1_scalar_get_b32((uchar *)(local_4038[0].x.n + 4),psVar34);
    auVar21._12_4_ = 0;
    auVar21._0_12_ = auStack_4144;
    _local_4148 = auVar21 << 0x20;
    _local_4178 = psVar27->illegal_callback;
    pcVar37 = local_4178;
    if (secp256k1_context_static == psVar27) goto LAB_0016e619;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    (psVar27->illegal_callback).data = psVar34;
    pcVar37 = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_30();
LAB_0016e619:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    psVar34 = (secp256k1_scalar *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("sig != NULL",psVar34);
  psVar27 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar27->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    auVar22._12_4_ = 0;
    auVar22._0_12_ = auStack_4144;
    _local_4148 = auVar22 << 0x20;
    _local_4178 = psVar27->illegal_callback;
    if (secp256k1_context_static == psVar27) goto LAB_0016e64d;
    pcVar33 = counting_callback_fn;
    (psVar27->illegal_callback).fn = counting_callback_fn;
    puVar36 = local_4148;
    (psVar27->illegal_callback).data = puVar36;
  }
  else {
    test_ecdsa_edge_cases_cold_31();
    psVar27 = extraout_RAX_12;
LAB_0016e64d:
    (*(psVar27->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
    pcVar33 = (CTX->illegal_callback).fn;
    puVar36 = (undefined1 *)(CTX->illegal_callback).data;
  }
  (*pcVar33)("input64 != NULL",puVar36);
  psVar32 = CTX;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
  (psVar32->illegal_callback).data = uStack_4170;
  if (local_4148 == (undefined1  [4])0x1) {
    iVar25 = secp256k1_ecdsa_signature_parse_compact
                       (psVar32,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4038);
    if (iVar25 == 0) goto LAB_0016e680;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].y.n[2]._0_4_ = 0xffffffff;
    local_4038[0].y.n[2]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].y.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    psVar32 = CTX;
    iVar25 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)local_4038);
    if (iVar25 == 0) {
      sigr = (secp256k1_scalar *)CONCAT71((int7)((ulong)pcVar37 >> 8),1);
      r = (secp256k1_gej *)local_4148;
      do {
        psVar34 = (secp256k1_scalar *)"";
        if ((char)sigr != '\0') {
          psVar34 = (secp256k1_scalar *)0x0;
        }
        _local_4148 = (undefined1  [16])0x0;
        auStack_4138 = SUB1615((undefined1  [16])0x0,0);
        uStack_4129 = 1;
        uStack_4170._0_4_ = 0xffffffff;
        local_4178 = (undefined1  [8])0xffffffffffffffff;
        uStack_4170._4_4_ = 0xffffffff;
        auStack_4168._8_4_ = 0xffffffff;
        auStack_4168._0_8_ = 0xffffffffffffffff;
        auStack_4168._12_4_ = 0xffffffff;
        in_R8 = (code *)0x0;
        psVar27 = (secp256k1_context *)local_4178;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)r,local_4178,
                            (secp256k1_nonce_function)0x0,psVar34);
        if (iVar25 != 0) goto LAB_0016e23f;
        lVar26 = 0;
        do {
          cVar1 = local_40b8[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 != '\0') goto LAB_0016e244;
        auStack_4168 = (undefined1  [16])0x0;
        local_4178 = (undefined1  [8])0x0;
        uStack_4170 = (void *)0x0;
        in_R8 = (code *)0x0;
        psVar27 = (secp256k1_context *)local_4178;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)r,local_4178,
                            (secp256k1_nonce_function)0x0,psVar34);
        if (iVar25 != 0) goto LAB_0016e249;
        lVar26 = 0;
        do {
          cVar1 = local_40b8[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 != '\0') goto LAB_0016e24e;
        auStack_4168[0xf] = 1;
        in_R8 = nonce_function_test_fail;
        psVar27 = (secp256k1_context *)local_4178;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)r,local_4178,
                            nonce_function_test_fail,psVar34);
        if (iVar25 != 0) goto LAB_0016e253;
        lVar26 = 0;
        do {
          cVar1 = local_40b8[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 != '\0') goto LAB_0016e258;
        in_R8 = nonce_function_test_retry;
        psVar27 = (secp256k1_context *)local_4178;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)r,local_4178,
                            nonce_function_test_retry,psVar34);
        if (iVar25 != 1) goto LAB_0016e25d;
        lVar26 = 0;
        do {
          cVar1 = local_40b8[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 == '\0') goto LAB_0016e262;
        in_R8 = nonce_function_rfc6979;
        psVar27 = (secp256k1_context *)local_4178;
        psVar32 = CTX;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r,local_4178,
                            nonce_function_rfc6979,psVar34);
        if (iVar25 != 1) goto LAB_0016e267;
        lVar26 = 0;
        do {
          cVar1 = local_4128[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 == '\0') goto LAB_0016e26c;
        lVar26 = 0;
        do {
          if (local_40b8[lVar26] != local_4128[lVar26]) goto LAB_0016e68a;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 0x40);
        in_R8 = (code *)0x0;
        psVar27 = (secp256k1_context *)local_4178;
        iVar25 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r,local_4178,
                            (secp256k1_nonce_function)0x0,psVar34);
        if (iVar25 != 1) goto LAB_0016e271;
        lVar26 = 0;
        do {
          cVar1 = local_4128[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          if (cVar1 != '\0') break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 == '\0') goto LAB_0016e276;
        lVar26 = 0;
        do {
          cVar1 = local_40b8[lVar26];
          psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
          pcVar37 = local_4128 + lVar26;
          if (cVar1 != *pcVar37) break;
          bVar40 = lVar26 != 0x3f;
          lVar26 = lVar26 + 1;
        } while (bVar40);
        if (cVar1 != *pcVar37) goto LAB_0016e27b;
        local_40e8._44_4_ = SUB84(sigr,0);
        lVar26 = 0;
        sigr = (secp256k1_scalar *)0x0;
        do {
          local_4148[0] = (char)sigr;
          in_R8 = (code *)0x0;
          psVar27 = (secp256k1_context *)local_4178;
          iVar25 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r,local_4178,
                              (secp256k1_nonce_function)0x0,psVar34);
          if (iVar25 != 1) {
            test_ecdsa_edge_cases_cold_45();
LAB_0016e230:
            test_ecdsa_edge_cases_cold_58();
            goto LAB_0016e235;
          }
          lVar39 = 0;
          do {
            cVar1 = local_4128[lVar39];
            psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
            if (cVar1 != '\0') break;
            bVar40 = lVar39 != 0x3f;
            lVar39 = lVar39 + 1;
          } while (bVar40);
          if (cVar1 == '\0') goto LAB_0016e230;
          local_4038[0].x.n[(long)sigr * 4 + 2] = local_4118;
          local_4038[0].y.n[(long)sigr * 4 + -2] = uStack_4110;
          local_4038[0].x.n[(long)sigr * 4] = _local_4128;
          local_4038[0].x.n[(long)sigr * 4 + 1] = auStack_4124._4_8_;
          if (sigr != (secp256k1_scalar *)0x0) {
            lVar39 = 0;
            do {
              if ((((local_4038[0].x.n[(long)sigr * 4] ==
                     *(uint64_t *)((long)local_4038[0].x.n + lVar39)) &&
                   (local_4038[0].x.n[(long)sigr * 4 + 1] ==
                    *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 8))) &&
                  (local_4038[0].x.n[(long)sigr * 4 + 2] ==
                   *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 0x10))) &&
                 (local_4038[0].y.n[(long)sigr * 4 + -2] ==
                  *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 0x18))) goto LAB_0016e11c;
              lVar39 = lVar39 + 0x20;
            } while (lVar26 != lVar39);
          }
          sigr = (secp256k1_scalar *)((long)sigr->d + 1);
          lVar26 = lVar26 + 0x20;
        } while (sigr != (secp256k1_scalar *)0x100);
        auVar23[0xf] = 0;
        auVar23._0_15_ = stack0xffffffffffffbeb9;
        _local_4148 = auVar23 << 8;
        uStack_4129 = 2;
        sigr = (secp256k1_scalar *)0x100;
        lVar26 = 0x2000;
        do {
          local_4178[0] = (char)sigr;
          in_R8 = (code *)0x0;
          psVar27 = (secp256k1_context *)local_4178;
          iVar25 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4128,(uchar *)r,local_4178,
                              (secp256k1_nonce_function)0x0,psVar34);
          if (iVar25 != 1) goto LAB_0016e235;
          lVar39 = 0;
          do {
            cVar1 = local_4128[lVar39];
            psVar27 = (secp256k1_context *)CONCAT71((int7)((ulong)psVar27 >> 8),cVar1);
            if (cVar1 != '\0') break;
            bVar40 = lVar39 != 0x3f;
            lVar39 = lVar39 + 1;
          } while (bVar40);
          if (cVar1 == '\0') goto LAB_0016e23a;
          local_4038[0].x.n[(long)sigr * 4] = _local_4128;
          local_4038[0].x.n[(long)sigr * 4 + 1] = auStack_4124._4_8_;
          local_4038[0].x.n[(long)sigr * 4 + 2] = local_4118;
          local_4038[0].y.n[(long)sigr * 4 + -2] = uStack_4110;
          lVar39 = 0;
          do {
            if (((local_4038[0].x.n[(long)sigr * 4] ==
                  *(uint64_t *)((long)local_4038[0].x.n + lVar39)) &&
                (local_4038[0].x.n[(long)sigr * 4 + 1] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 8))) &&
               ((local_4038[0].x.n[(long)sigr * 4 + 2] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 0x10) &&
                (local_4038[0].y.n[(long)sigr * 4 + -2] ==
                 *(uint64_t *)((long)local_4038[0].x.n + lVar39 + 0x18))))) goto LAB_0016e117;
            lVar39 = lVar39 + 0x20;
          } while (lVar26 != lVar39);
          sigr = (secp256k1_scalar *)((long)sigr->d + 1);
          lVar26 = lVar26 + 0x20;
        } while (sigr != (secp256k1_scalar *)0x200);
        sigr = (secp256k1_scalar *)0x0;
      } while ((local_40e8._44_4_ & 1) != 0);
      local_4118 = 0;
      uStack_4110 = 0;
      _local_4128 = (undefined1  [16])0x0;
      lVar26 = 0;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auStack_4144._4_8_;
      _local_4148 = auVar24 << 0x40;
      local_40e8._0_8_ = 0;
      local_4058[0] = 0;
      local_4038[0].x.n[0] = 0x4d430001;
      local_4038[0].x.n[1] = (uint64_t)local_4058;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = (secp256k1_context *)0x0;
      nonce_function_rfc6979(local_4178,local_4128,local_4128,(uchar *)0x0,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = (secp256k1_context *)0x0;
      local_4038[0].x.n[1] = (uint64_t)local_4178;
      nonce_function_rfc6979((uchar *)r,local_4128,local_4128,local_4128,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = (secp256k1_context *)0x0;
      local_4038[0].x.n[1] = (uint64_t)r;
      nonce_function_rfc6979(local_40e8,local_4128,local_4128,(uchar *)0x0,local_4128,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = (secp256k1_context *)0x0;
      local_4038[0].x.n[1] = (uint64_t)local_40e8;
      nonce_function_rfc6979((uchar *)local_4058,local_4128,local_4128,local_4128,local_4128,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[1] = (uint64_t)local_4058;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].y.n[0] = 0;
      local_4150 = (secp256k1_context *)0x0;
      goto LAB_0016e0fe;
    }
  }
  else {
    test_ecdsa_edge_cases_cold_32();
LAB_0016e680:
    test_ecdsa_edge_cases_cold_62();
  }
  test_ecdsa_edge_cases_cold_33();
LAB_0016e68a:
  test_ecdsa_edge_cases_cold_42();
  goto LAB_0016e68f;
LAB_0016e235:
  test_ecdsa_edge_cases_cold_47();
LAB_0016e23a:
  test_ecdsa_edge_cases_cold_57();
LAB_0016e23f:
  test_ecdsa_edge_cases_cold_34();
LAB_0016e244:
  test_ecdsa_edge_cases_cold_35();
LAB_0016e249:
  test_ecdsa_edge_cases_cold_36();
LAB_0016e24e:
  test_ecdsa_edge_cases_cold_37();
LAB_0016e253:
  test_ecdsa_edge_cases_cold_38();
LAB_0016e258:
  test_ecdsa_edge_cases_cold_39();
LAB_0016e25d:
  test_ecdsa_edge_cases_cold_40();
LAB_0016e262:
  test_ecdsa_edge_cases_cold_61();
LAB_0016e267:
  test_ecdsa_edge_cases_cold_41();
LAB_0016e26c:
  test_ecdsa_edge_cases_cold_60();
LAB_0016e271:
  test_ecdsa_edge_cases_cold_43();
LAB_0016e276:
  test_ecdsa_edge_cases_cold_59();
LAB_0016e27b:
  test_ecdsa_edge_cases_cold_44();
LAB_0016e280:
  test_ecdsa_edge_cases_cold_1();
LAB_0016e285:
  test_ecdsa_edge_cases_cold_83();
LAB_0016e28a:
  test_ecdsa_edge_cases_cold_2();
LAB_0016e28f:
  test_ecdsa_edge_cases_cold_82();
LAB_0016e294:
  test_ecdsa_edge_cases_cold_3();
LAB_0016e299:
  test_ecdsa_edge_cases_cold_81();
LAB_0016e29e:
  test_ecdsa_edge_cases_cold_80();
  psVar28 = psVar27;
LAB_0016e2a3:
  psVar29 = psVar28;
  test_ecdsa_edge_cases_cold_79();
LAB_0016e2a8:
  test_ecdsa_edge_cases_cold_78();
  psVar30 = psVar29;
LAB_0016e2ad:
  psVar31 = psVar30;
  test_ecdsa_edge_cases_cold_77();
LAB_0016e2b2:
  test_ecdsa_edge_cases_cold_76();
  psVar32 = psVar31;
LAB_0016e2b7:
  pcVar33 = (code *)psVar32;
  test_ecdsa_edge_cases_cold_4();
LAB_0016e2bc:
  test_ecdsa_edge_cases_cold_5();
LAB_0016e2c1:
  test_ecdsa_edge_cases_cold_75();
LAB_0016e2c6:
  test_ecdsa_edge_cases_cold_74();
LAB_0016e2cb:
  test_ecdsa_edge_cases_cold_73();
LAB_0016e2d0:
  test_ecdsa_edge_cases_cold_72();
LAB_0016e2d5:
  test_ecdsa_edge_cases_cold_71();
LAB_0016e2da:
  test_ecdsa_edge_cases_cold_70();
LAB_0016e2df:
  test_ecdsa_edge_cases_cold_6();
LAB_0016e2e4:
  test_ecdsa_edge_cases_cold_7();
LAB_0016e2e9:
  test_ecdsa_edge_cases_cold_69();
LAB_0016e2ee:
  test_ecdsa_edge_cases_cold_68();
LAB_0016e2f3:
  psVar35 = psVar34;
  test_ecdsa_edge_cases_cold_67();
LAB_0016e2f8:
  test_ecdsa_edge_cases_cold_8();
LAB_0016e2fd:
  test_ecdsa_edge_cases_cold_9();
LAB_0016e302:
  test_ecdsa_edge_cases_cold_10();
LAB_0016e307:
  test_ecdsa_edge_cases_cold_11();
  psVar27 = extraout_RAX;
LAB_0016e30c:
  (*(psVar27->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar27->illegal_callback).data);
  psVar27 = CTX;
  goto LAB_0016d0fe;
  while (lVar26 = lVar26 + 1, lVar26 != 0x20) {
LAB_0016e0fe:
    if (local_4178[lVar26] != local_4148[lVar26]) goto LAB_0016e121;
  }
  test_ecdsa_edge_cases_cold_56();
LAB_0016e117:
  test_ecdsa_edge_cases_cold_48();
LAB_0016e11c:
  test_ecdsa_edge_cases_cold_46();
LAB_0016e121:
  lVar26 = 0;
  do {
    if (local_4178[lVar26] != local_40e8[lVar26]) goto LAB_0016e13d;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  test_ecdsa_edge_cases_cold_55();
LAB_0016e13d:
  lVar26 = 0;
  do {
    if (local_4178[lVar26] != *(char *)((long)local_4058 + lVar26)) goto LAB_0016e159;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  test_ecdsa_edge_cases_cold_54();
LAB_0016e159:
  lVar26 = 0;
  do {
    if (local_4148[lVar26] != local_40e8[lVar26]) goto LAB_0016e176;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  test_ecdsa_edge_cases_cold_53();
LAB_0016e176:
  lVar26 = 0;
  do {
    if (local_4148[lVar26] != *(char *)((long)local_4058 + lVar26)) goto LAB_0016e193;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  test_ecdsa_edge_cases_cold_52();
LAB_0016e193:
  lVar26 = 0;
  do {
    if (local_40e8[lVar26] != *(char *)((long)local_4058 + lVar26)) goto LAB_0016e1b3;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  test_ecdsa_edge_cases_cold_51();
LAB_0016e1b3:
  local_4118._0_1_ = 0xba;
  local_4118._1_1_ = 0xae;
  local_4118._2_1_ = 0xdc;
  local_4118._3_1_ = 0xe6;
  local_4118._4_1_ = 0xaf;
  local_4118._5_1_ = 'H';
  local_4118._6_1_ = 0xa0;
  local_4118._7_1_ = ';';
  uStack_4110._0_1_ = 0xbf;
  uStack_4110._1_1_ = 0xd2;
  uStack_4110._2_1_ = '^';
  uStack_4110._3_1_ = 0x8c;
  uStack_4110._4_1_ = 0xd0;
  uStack_4110._5_1_ = '6';
  uStack_4110._6_1_ = 'A';
  uStack_4110._7_1_ = 'A';
  auStack_4124[4] = 0xff;
  auStack_4124[5] = 0xff;
  auStack_4124[6] = 0xff;
  auStack_4124[7] = 0xff;
  auStack_4124[8] = 0xff;
  auStack_4124[9] = 0xff;
  auStack_4124[10] = 0xff;
  auStack_4124[0xb] = 0xfe;
  local_4128[0] = 0xff;
  local_4128[1] = 0xff;
  local_4128[2] = 0xff;
  local_4128[3] = 0xff;
  auStack_4124[0] = 0xff;
  auStack_4124[1] = 0xff;
  auStack_4124[2] = 0xff;
  auStack_4124[3] = 0xff;
  in_R8 = (code *)0x0;
  psVar32 = CTX;
  iVar25 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4178,local_4128,0);
  if (iVar25 == 0) {
    in_R8 = (code *)0x1;
    psVar32 = CTX;
    iVar25 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4178,local_4128,1);
    if (iVar25 == 0) {
      return;
    }
  }
  else {
LAB_0016e68f:
    test_ecdsa_edge_cases_cold_49();
  }
  test_ecdsa_edge_cases_cold_50();
  uVar2 = *(undefined8 *)in_R8;
  uVar3 = *(uint64_t *)(in_R8 + 8);
  uVar4 = *(uint64_t *)(in_R8 + 0x18);
  (psVar32->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(in_R8 + 0x10);
  (psVar32->ecmult_gen_ctx).scalar_offset.d[2] = uVar4;
  *(undefined8 *)&psVar32->ecmult_gen_ctx = uVar2;
  (psVar32->ecmult_gen_ctx).scalar_offset.d[0] = uVar3;
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}